

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-select.c
# Opt level: O0

ssh_cipher * aes_select(ssh_cipheralg *alg)

{
  void *pvVar1;
  ssh_cipheralg *alg_00;
  _Bool _Var2;
  ssh_cipher *psVar3;
  aes_extra *alg_extra;
  ssh_cipheralg *alg_1;
  size_t i;
  ssh_cipheralg **real_algs;
  ssh_cipheralg *alg_local;
  
  pvVar1 = alg->extra;
  alg_1 = (ssh_cipheralg *)0x0;
  while( true ) {
    if (*(long *)((long)pvVar1 + (long)alg_1 * 8) == 0) {
      __assert_fail("false && \"aes_select ran off the end of its list\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/aes-select.c"
                    ,0x1b,"ssh_cipher *aes_select(const ssh_cipheralg *)");
    }
    alg_00 = *(ssh_cipheralg **)((long)pvVar1 + (long)alg_1 * 8);
    _Var2 = check_availability((aes_extra *)alg_00->extra);
    if (_Var2) break;
    alg_1 = (ssh_cipheralg *)((long)&alg_1->new + 1);
  }
  psVar3 = ssh_cipher_new(alg_00);
  return psVar3;
}

Assistant:

static ssh_cipher *aes_select(const ssh_cipheralg *alg)
{
    const ssh_cipheralg *const *real_algs = (const ssh_cipheralg **)alg->extra;

    for (size_t i = 0; real_algs[i]; i++) {
        const ssh_cipheralg *alg = real_algs[i];
        const struct aes_extra *alg_extra =
            (const struct aes_extra *)alg->extra;
        if (check_availability(alg_extra))
            return ssh_cipher_new(alg);
    }

    /* We should never reach the NULL at the end of the list, because
     * the last non-NULL entry should be software-only AES, which is
     * always available. */
    unreachable("aes_select ran off the end of its list");
}